

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.cc
# Opt level: O0

ostream * cnn::operator<<(ostream *os,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *ds)

{
  ostream *poVar1;
  Dim *d;
  ostream *poVar2;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RSI;
  char *pcVar3;
  ostream *in_RDI;
  uint i;
  uint local_14;
  
  std::operator<<(in_RDI,'[');
  local_14 = 0;
  while( true ) {
    poVar2 = (ostream *)(ulong)local_14;
    poVar1 = (ostream *)std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RSI);
    if (poVar1 <= poVar2) break;
    pcVar3 = "";
    if (local_14 != 0) {
      pcVar3 = " ";
    }
    d = (Dim *)std::operator<<(in_RDI,pcVar3);
    std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RSI,(ulong)local_14);
    operator<<(poVar2,d);
    local_14 = local_14 + 1;
  }
  poVar2 = std::operator<<(in_RDI,']');
  return poVar2;
}

Assistant:

ostream& operator<<(ostream& os, const vector<Dim>& ds) {
  os << '[';
  for (unsigned i = 0; i < ds.size(); ++i)
    os << (i ? " " : "") << ds[i];
  return os << ']';
}